

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::ConstScalarMultiply::backward_impl
          (ConstScalarMultiply *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  Index size;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  int iVar24;
  undefined1 auVar25 [16];
  ulong uVar9;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes.cc"
                  ,0x1b0,
                  "virtual void cnn::ConstScalarMultiply::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  uVar9 = (ulong)(dEdf->d).nd;
  iVar24 = 1;
  iVar23 = 1;
  if (uVar9 != 0) {
    auVar16 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar19 = vpbroadcastq_avx512f();
    uVar11 = 0;
    do {
      auVar20 = vpbroadcastq_avx512f();
      auVar21 = vmovdqa64_avx512f(auVar16);
      auVar16 = vporq_avx512f(auVar20,auVar17);
      auVar20 = vporq_avx512f(auVar20,auVar18);
      uVar5 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar16,auVar19,2);
      bVar7 = (byte)uVar5;
      uVar14 = CONCAT11(bVar7,bVar6);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar11));
      auVar20._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar16._4_4_;
      auVar20._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar16._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar16._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar16._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar16._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar16._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar16._28_4_;
      auVar20._32_4_ = (uint)(bVar7 & 1) * auVar16._32_4_;
      auVar20._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar16._36_4_;
      auVar20._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar16._40_4_;
      auVar20._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar16._44_4_;
      auVar20._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar16._48_4_;
      auVar20._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar16._52_4_;
      auVar20._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar16._56_4_;
      auVar20._60_4_ = (uint)(bVar7 >> 7) * auVar16._60_4_;
      uVar11 = uVar11 + 0x10;
      auVar16 = vpmulld_avx512f(auVar20,auVar21);
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar11);
    auVar16 = vmovdqa32_avx512f(auVar16);
    auVar17._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._0_4_;
    bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar21._4_4_;
    bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar21._8_4_;
    bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar21._12_4_;
    bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar21._16_4_;
    bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar21._20_4_;
    bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar21._24_4_;
    bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar21._28_4_;
    auVar17._32_4_ = (uint)(bVar7 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._32_4_;
    bVar3 = (bool)(bVar7 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar21._36_4_;
    bVar3 = (bool)(bVar7 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar21._40_4_;
    bVar3 = (bool)(bVar7 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar21._44_4_;
    bVar3 = (bool)(bVar7 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar21._48_4_;
    bVar3 = (bool)(bVar7 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar21._52_4_;
    bVar3 = (bool)(bVar7 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar21._56_4_;
    auVar17._60_4_ =
         (uint)(bVar7 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar21._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar17,1);
    auVar16 = vpmulld_avx512f(auVar17,ZEXT3264(auVar15));
    auVar25 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar4 = vpshufd_avx(auVar25,0xee);
    auVar25 = vpmulld_avx(auVar25,auVar4);
    auVar4 = vpshufd_avx(auVar25,0x55);
    auVar25 = vpmulld_avx(auVar25,auVar4);
    iVar23 = auVar25._0_4_;
  }
  uVar9 = (ulong)(dEdxi->d).nd;
  if (uVar9 != 0) {
    auVar16 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar19 = vpbroadcastq_avx512f();
    uVar11 = 0;
    do {
      auVar20 = vpbroadcastq_avx512f();
      auVar21 = vmovdqa64_avx512f(auVar16);
      auVar16 = vporq_avx512f(auVar20,auVar17);
      auVar20 = vporq_avx512f(auVar20,auVar18);
      uVar5 = vpcmpuq_avx512f(auVar20,auVar19,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar16,auVar19,2);
      bVar7 = (byte)uVar5;
      uVar14 = CONCAT11(bVar7,bVar6);
      auVar16 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar11));
      auVar22._4_4_ = (uint)((byte)(uVar14 >> 1) & 1) * auVar16._4_4_;
      auVar22._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar14 >> 2) & 1) * auVar16._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar14 >> 3) & 1) * auVar16._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar14 >> 4) & 1) * auVar16._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar14 >> 5) & 1) * auVar16._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar14 >> 6) & 1) * auVar16._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar14 >> 7) & 1) * auVar16._28_4_;
      auVar22._32_4_ = (uint)(bVar7 & 1) * auVar16._32_4_;
      auVar22._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar16._36_4_;
      auVar22._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar16._40_4_;
      auVar22._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar16._44_4_;
      auVar22._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar16._48_4_;
      auVar22._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar16._52_4_;
      auVar22._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar16._56_4_;
      auVar22._60_4_ = (uint)(bVar7 >> 7) * auVar16._60_4_;
      uVar11 = uVar11 + 0x10;
      auVar16 = vpmulld_avx512f(auVar22,auVar21);
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar11);
    auVar16 = vmovdqa32_avx512f(auVar16);
    auVar18._0_4_ = (uint)(bVar6 & 1) * auVar16._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._0_4_;
    bVar3 = (bool)((byte)(uVar14 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar3 * auVar16._4_4_ | (uint)!bVar3 * auVar21._4_4_;
    bVar3 = (bool)((byte)(uVar14 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar3 * auVar16._8_4_ | (uint)!bVar3 * auVar21._8_4_;
    bVar3 = (bool)((byte)(uVar14 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar3 * auVar16._12_4_ | (uint)!bVar3 * auVar21._12_4_;
    bVar3 = (bool)((byte)(uVar14 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar3 * auVar16._16_4_ | (uint)!bVar3 * auVar21._16_4_;
    bVar3 = (bool)((byte)(uVar14 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar3 * auVar16._20_4_ | (uint)!bVar3 * auVar21._20_4_;
    bVar3 = (bool)((byte)(uVar14 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar3 * auVar16._24_4_ | (uint)!bVar3 * auVar21._24_4_;
    bVar3 = (bool)((byte)(uVar14 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar3 * auVar16._28_4_ | (uint)!bVar3 * auVar21._28_4_;
    auVar18._32_4_ = (uint)(bVar7 & 1) * auVar16._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar21._32_4_;
    bVar3 = (bool)(bVar7 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar3 * auVar16._36_4_ | (uint)!bVar3 * auVar21._36_4_;
    bVar3 = (bool)(bVar7 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar3 * auVar16._40_4_ | (uint)!bVar3 * auVar21._40_4_;
    bVar3 = (bool)(bVar7 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar3 * auVar16._44_4_ | (uint)!bVar3 * auVar21._44_4_;
    bVar3 = (bool)(bVar7 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar3 * auVar16._48_4_ | (uint)!bVar3 * auVar21._48_4_;
    bVar3 = (bool)(bVar7 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar3 * auVar16._52_4_ | (uint)!bVar3 * auVar21._52_4_;
    bVar3 = (bool)(bVar7 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar3 * auVar16._56_4_ | (uint)!bVar3 * auVar21._56_4_;
    auVar18._60_4_ =
         (uint)(bVar7 >> 7) * auVar16._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar21._60_4_;
    auVar15 = vextracti64x4_avx512f(auVar18,1);
    auVar16 = vpmulld_avx512f(auVar18,ZEXT3264(auVar15));
    auVar25 = vpmulld_avx(auVar16._0_16_,auVar16._16_16_);
    auVar4 = vpshufd_avx(auVar25,0xee);
    auVar25 = vpmulld_avx(auVar25,auVar4);
    auVar4 = vpshufd_avx(auVar25,0x55);
    auVar25 = vpmulld_avx(auVar25,auVar4);
    iVar24 = auVar25._0_4_;
  }
  uVar8 = iVar24 * (dEdxi->d).bd;
  uVar9 = (ulong)uVar8;
  if (uVar8 != iVar23 * (dEdf->d).bd) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  pfVar1 = dEdxi->v;
  uVar11 = uVar9;
  if ((((ulong)pfVar1 & 3) == 0) &&
     (uVar11 = (ulong)(-((uint)((ulong)pfVar1 >> 2) & 0x3fffffff) & 0xf), uVar9 <= uVar11)) {
    uVar11 = uVar9;
  }
  pfVar2 = dEdf->v;
  uVar12 = uVar9 - uVar11;
  uVar10 = uVar12 + 0xf;
  if (-1 < (long)uVar12) {
    uVar10 = uVar12;
  }
  auVar25 = ZEXT416((uint)this->alpha);
  if (uVar11 != 0) {
    uVar13 = 0;
    do {
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar13]),auVar25,ZEXT416((uint)pfVar1[uVar13]));
      pfVar1[uVar13] = auVar4._0_4_;
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  uVar10 = (uVar10 & 0xfffffffffffffff0) + uVar11;
  if (0xf < (long)uVar12) {
    auVar16 = vbroadcastss_avx512f(auVar25);
    do {
      auVar17 = vfmadd213ps_avx512f(*(undefined1 (*) [64])(pfVar2 + uVar11),auVar16,
                                    *(undefined1 (*) [64])(pfVar1 + uVar11));
      *(undefined1 (*) [64])(pfVar1 + uVar11) = auVar17;
      uVar11 = uVar11 + 0x10;
    } while ((long)uVar11 < (long)uVar10);
  }
  if ((long)uVar10 < (long)uVar9) {
    do {
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar2[uVar10]),auVar25,ZEXT416((uint)pfVar1[uVar10]));
      pfVar1[uVar10] = auVar4._0_4_;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  return;
}

Assistant:

void ConstScalarMultiply::backward_impl(const vector<const Tensor*>& xs,
                                   const Tensor& fx,
                                   const Tensor& dEdf,
                                   unsigned i,
                                   Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("ScalarMultiply not yet implemented for CUDA");
#else
  dEdxi.vec() += dEdf.vec() * alpha;
#endif
}